

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O0

void __thiscall Professor::print(Professor *this,bool with_marks)

{
  ostream *poVar1;
  bool with_marks_local;
  Professor *this_local;
  
  std::operator<<((ostream *)&std::cout,"prof: ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->surname);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->middle_name);
  std::operator<<(poVar1," ");
  if (with_marks) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->knowledge);
    std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->skill);
    std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->social);
    std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->loyality);
    std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->total);
    std::operator<<(poVar1," ");
  }
  return;
}

Assistant:

void Professor::print (bool with_marks){

    std::cout << "prof: ";
    std::cout << surname << " ";
    std::cout << name << " ";
    std::cout << middle_name << " ";
    if (with_marks) {
        std::cout << knowledge << " ";
        std::cout << skill << " ";
        std::cout << social << " ";
        std::cout << loyality << " ";
        std::cout << total << " ";
    }

}